

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O1

int nn_node_unsubscribe(nn_trie_node **self,uint8_t *data,size_t size)

{
  uint16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  undefined8 in_RAX;
  nn_trie_node **self_00;
  nn_trie_node *pnVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  long *plVar13;
  nn_trie_node *pnVar14;
  byte *pbVar15;
  ulong uVar16;
  bool bVar17;
  int local_34;
  
  if (size != 0) {
    pnVar7 = *self;
    bVar4 = pnVar7->prefix_len;
    uVar10 = (ulong)(uint)bVar4;
    uVar6 = (uint)bVar4;
    if (bVar4 != 0) {
      uVar10 = 0;
      do {
        if (size == uVar10) {
          uVar10 = size & 0xffffffff;
          goto LAB_0012583a;
        }
        if (pnVar7->prefix[uVar10] != data[uVar10]) goto LAB_0012583a;
        uVar10 = uVar10 + 1;
      } while (bVar4 != uVar10);
      uVar10 = (ulong)uVar6;
    }
LAB_0012583a:
    if ((uint)uVar10 != uVar6) {
      return 0;
    }
    uVar10 = (ulong)uVar6;
    if (uVar10 != size) {
      pbVar15 = data + uVar10;
      self_00 = nn_node_next(pnVar7,*pbVar15);
      if (self_00 == (nn_trie_node **)0x0) {
        return 0;
      }
      iVar5 = nn_node_unsubscribe(self_00,pbVar15 + 1,~uVar10 + size);
      if (iVar5 == 0) {
        return 0;
      }
      if (*self_00 != (nn_trie_node *)0x0) {
        return 1;
      }
      pnVar7 = *self;
      bVar4 = pnVar7->type;
      if (bVar4 < 9) {
        bVar17 = bVar4 == 0;
        if (!bVar17) {
          if ((pnVar7->u).sparse.children[0] == *pbVar15) {
            uVar16 = 0;
          }
          else {
            uVar10 = 0;
            do {
              bVar17 = (ulong)(uint)bVar4 - 1 == uVar10;
              if (bVar17) goto LAB_00125bcb;
              uVar16 = uVar10 + 1;
              lVar12 = uVar10 + 0xb;
              uVar10 = uVar16;
            } while (pnVar7->prefix[lVar12] != *pbVar15);
          }
          if (!bVar17) {
            uVar10 = uVar16 & 0xffffffff;
            memmove(pnVar7->prefix + uVar10 + 10,pnVar7->prefix + uVar10 + 0xb,
                    (long)(int)((uint)bVar4 + ~(uint)uVar16));
            pnVar7 = *self;
            memmove(pnVar7[1].prefix + uVar10 * 8 + -6,pnVar7[1].prefix + uVar10 * 8 + 2,
                    ((long)(int)~(uint)uVar16 + (ulong)pnVar7->type) * 8);
            pnVar7 = *self;
            bVar4 = pnVar7->type - 1;
            pnVar7->type = bVar4;
            pnVar7 = (nn_trie_node *)nn_realloc(pnVar7,(ulong)bVar4 * 8 + 0x18);
            *self = pnVar7;
            if (pnVar7 == (nn_trie_node *)0x0) {
              __assert_fail("*self",
                            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/protocols/pubsub/trie.c"
                            ,0x21c,
                            "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)"
                           );
            }
            if ((pnVar7->type == '\0') && (pnVar7->refcount == 0)) {
              nn_free(pnVar7);
              *self = (nn_trie_node *)0x0;
              return 1;
            }
            pnVar7 = nn_node_compact(pnVar7);
            *self = pnVar7;
            return 1;
          }
        }
LAB_00125bcb:
        __assert_fail("index != (*self)->type",
                      "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/protocols/pubsub/trie.c"
                      ,0x20e,
                      "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
      }
      uVar3 = (pnVar7->u).dense.nbr;
      if (uVar3 < 10) {
        pnVar7 = (nn_trie_node *)nn_alloc_(0x58);
        if (pnVar7 == (nn_trie_node *)0x0) {
          __assert_fail("new_node",
                        "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/protocols/pubsub/trie.c"
                        ,0x25e,
                        "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
        }
        pnVar7->refcount = 0;
        pnVar14 = *self;
        bVar4 = pnVar14->prefix_len;
        pnVar7->prefix_len = bVar4;
        memcpy(pnVar7->prefix,pnVar14->prefix,(ulong)bVar4);
        pnVar7->type = '\b';
        pnVar14 = *self;
        bVar4 = (pnVar14->u).sparse.children[0];
        uVar11 = (uint)bVar4;
        uVar6 = 0;
        if ((pnVar14->u).sparse.children[1] + 1 != (uint)bVar4) {
          uVar10 = 0;
          do {
            lVar12 = *(long *)(pnVar14[1].prefix + uVar10 * 8 + -6);
            if (lVar12 != 0) {
              pnVar7->prefix[(long)(int)uVar6 + 10] = (char)uVar11 + (char)uVar10;
              *(long *)(pnVar7[1].prefix + (long)(int)uVar6 * 8 + -6) = lVar12;
              uVar6 = uVar6 + 1;
            }
            uVar10 = uVar10 + 1;
            pnVar14 = *self;
            uVar11 = (uint)(pnVar14->u).sparse.children[0];
          } while (uVar10 != ((pnVar14->u).sparse.children[1] - uVar11) + 1);
          uVar6 = (uint)(uVar6 == 8);
        }
        if ((char)uVar6 != '\0') {
          nn_free(pnVar14);
          *self = pnVar7;
          return 1;
        }
        __assert_fail("j == NN_TRIE_SPARSE_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/protocols/pubsub/trie.c"
                      ,0x26d,
                      "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
      }
      bVar4 = (pnVar7->u).sparse.children[0];
      uVar10 = (ulong)bVar4;
      uVar6 = (uint)bVar4;
      if (*pbVar15 != bVar4) {
        bVar2 = (pnVar7->u).sparse.children[1];
        if (*pbVar15 != bVar2) {
          (pnVar7->u).dense.nbr = uVar3 - 1;
          return 1;
        }
        uVar11 = (uint)bVar2;
        iVar5 = uVar11 - uVar6;
        if (iVar5 != 0) {
          plVar13 = (long *)((long)pnVar7 + ((ulong)uVar11 * 8 - (ulong)((uint)bVar4 * 8)) + 0x18);
          do {
            if (*plVar13 != 0) {
              iVar5 = uVar11 - (int)uVar10;
              goto LAB_00125b6e;
            }
            uVar10 = uVar10 + 1;
            plVar13 = plVar13 + -1;
          } while (uVar11 != uVar10);
          iVar5 = 0;
        }
LAB_00125b6e:
        (pnVar7->u).sparse.children[1] = (char)iVar5 + bVar4;
        puVar1 = &((*self)->u).dense.nbr;
        *puVar1 = *puVar1 - 1;
        pnVar7 = *self;
        pnVar7 = (nn_trie_node *)
                 nn_realloc(pnVar7,((ulong)(pnVar7->u).sparse.children[1] -
                                   (ulong)(pnVar7->u).sparse.children[0]) * 8 + 0x20);
        *self = pnVar7;
        if (pnVar7 != (nn_trie_node *)0x0) {
          return 1;
        }
        __assert_fail("*self",
                      "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/protocols/pubsub/trie.c"
                      ,0x251,
                      "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
      }
      uVar11 = (uint)(pnVar7->u).sparse.children[1];
      uVar8 = uVar11 - uVar6;
      if (uVar8 == 0xffffffff) {
        uVar9 = 0;
      }
      else {
        uVar9 = uVar8 + 1;
        lVar12 = 0;
        do {
          if (*(long *)(pnVar7[1].prefix + lVar12 * 8 + -6) != 0) {
            uVar9 = (uint)lVar12;
            break;
          }
          lVar12 = lVar12 + 1;
        } while ((ulong)uVar8 + 1 != lVar12);
      }
      iVar5 = uVar6 + uVar9;
      memmove(pnVar7 + 1,pnVar7[1].prefix + (ulong)uVar9 * 8 + -6,
              (long)(int)((uVar11 - iVar5) + 1) << 3);
      ((*self)->u).sparse.children[0] = (uint8_t)iVar5;
      puVar1 = &((*self)->u).dense.nbr;
      *puVar1 = *puVar1 - 1;
      pnVar7 = (nn_trie_node *)
               nn_realloc(*self,(long)(int)(((uint)((*self)->u).sparse.children[1] - iVar5) + 1) * 8
                                + 0x18);
      *self = pnVar7;
      if (pnVar7 != (nn_trie_node *)0x0) {
        return 1;
      }
      __assert_fail("*self",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/protocols/pubsub/trie.c"
                    ,0x242,
                    "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
    }
  }
  if (*self == (nn_trie_node *)0x0) {
    local_34 = -0x16;
  }
  else {
    nn_node_unsubscribe_cold_1();
    local_34 = (int)((ulong)in_RAX >> 0x20);
  }
  return local_34;
}

Assistant:

static int nn_node_unsubscribe (struct nn_trie_node **self,
    const uint8_t *data, size_t size)
{
    int i;
    int j;
    int index;
    int new_min;
    struct nn_trie_node **ch;
    struct nn_trie_node *new_node;
    struct nn_trie_node *ch2;

    if (!size)
        goto found;

    /*  If prefix does not match the data, return. */
    if (nn_node_check_prefix (*self, data, size) != (*self)->prefix_len)
        return 0;

    /*  Skip the prefix. */
    data += (*self)->prefix_len;
    size -= (*self)->prefix_len;

    if (!size)
        goto found;

    /*  Move to the next node. */
    ch = nn_node_next (*self, *data);
    if (!ch)
        return 0; /*  TODO: This should be an error. */

    /*  Recursive traversal of the trie happens here. If the subscription
        wasn't really removed, nothing have changed in the trie and
        no additional pruning is needed. */
    if (nn_node_unsubscribe (ch, data + 1, size - 1) == 0)
        return 0;

    /*  Subscription removal is already done. Now we are going to compact
        the trie. However, if the following node remains in place, there's
        nothing to compact here. */
    if (*ch)
        return 1;

    /*  Sparse array. */
    if ((*self)->type < NN_TRIE_DENSE_TYPE) {

        /*  Get the indices of the removed child. */
        for (index = 0; index != (*self)->type; ++index)
            if ((*self)->u.sparse.children [index] == *data)
                break;
        assert (index != (*self)->type);

        /*  Remove the destroyed child from both lists of children. */
        memmove (
            (*self)->u.sparse.children + index,
            (*self)->u.sparse.children + index + 1,
            (*self)->type - index - 1);
        memmove (
            nn_node_child (*self, index),
            nn_node_child (*self, index + 1),
            ((*self)->type - index - 1) * sizeof (struct nn_trie_node*));
        --(*self)->type;
        *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
            ((*self)->type * sizeof (struct nn_trie_node*)));
        assert (*self);
        
        /*  If there are no more children and no refcount, we can delete
            the node altogether. */
        if (!(*self)->type && !nn_node_has_subscribers (*self)) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);

        return 1;
    }

    /*  Dense array. */

    /*  In this case the array stays dense. We have to adjust the limits of
        the array, if appropriate. */
    if ((*self)->u.dense.nbr > NN_TRIE_SPARSE_MAX + 1) {

        /*  If the removed item is the leftmost one, trim the array from
            the left side. */
        if (*data == (*self)->u.dense.min) {
             for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
                   ++i)
                 if (*nn_node_child (*self, i))
                     break;
             new_min = i + (*self)->u.dense.min;
             memmove (nn_node_child (*self, 0), nn_node_child (*self, i),
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             (*self)->u.dense.min = new_min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the removed item is the rightmost one, trim the array from
            the right side. */
        if (*data == (*self)->u.dense.max) {
             for (i = (*self)->u.dense.max - (*self)->u.dense.min; i != 0; --i)
                 if (*nn_node_child (*self, i))
                     break;
             (*self)->u.dense.max = i + (*self)->u.dense.min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - (*self)->u.dense.min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the item is removed from the middle of the array, do nothing. */
        --(*self)->u.dense.nbr;
        return 1;
    }

    /*  Convert dense array into sparse array. */
    {
        new_node = nn_alloc (sizeof (struct nn_trie_node) +
            NN_TRIE_SPARSE_MAX * sizeof (struct nn_trie_node*), "trie node");
        assert (new_node);
        new_node->refcount = 0;
        new_node->prefix_len = (*self)->prefix_len;
        memcpy (new_node->prefix, (*self)->prefix, new_node->prefix_len);
        new_node->type = NN_TRIE_SPARSE_MAX;
        j = 0;
        for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
              ++i) {
            ch2 = *nn_node_child (*self, i);
            if (ch2) {
                new_node->u.sparse.children [j] = i + (*self)->u.dense.min;
                *nn_node_child (new_node, j) = ch2;
                ++j;
            }
        }
        assert (j == NN_TRIE_SPARSE_MAX);
        nn_free (*self);
        *self = new_node;
        return 1;
    }

found:

    /*  We are at the end of the subscription here. */

    /*  Subscription doesn't exist. */
    if (nn_slow (!*self || !nn_node_has_subscribers (*self)))
        return -EINVAL;

    /*  Subscription exists. Unsubscribe. */
    --(*self)->refcount;

    /*  If reference count has dropped to zero we can try to compact
        the node. */
    if (!(*self)->refcount) {

        /*  If there are no children, we can delete the node altogether. */
        if (!(*self)->type) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);
        return 1;
    }

    return 0;
}